

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall DRAG<RemSP>::FirstScan(DRAG<RemSP> *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0x8;
  uVar14 = (ulong)iVar3;
  iVar4 = *(int *)&pMVar5->field_0xc;
  lVar21 = (long)iVar4;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  if (0 < (long)uVar14) {
    uVar12 = 0;
    do {
      if (0 < iVar4) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar10 = **(long **)&pMVar5->field_0x48;
        lVar11 = lVar10 * uVar12 + *(long *)&pMVar5->field_0x10;
        lVar19 = lVar11 - lVar10;
        lVar15 = lVar19 - lVar10;
        lVar10 = lVar10 + lVar11;
        lVar7 = **(long **)&pMVar6->field_0x48;
        lVar18 = lVar7 * uVar12 + *(long *)&pMVar6->field_0x10;
        lVar16 = lVar18 + lVar7 * -2;
        lVar7 = lVar15 + -1;
        uVar17 = uVar12 | 1;
        uVar20 = 0;
        do {
          if (*(char *)(lVar11 + uVar20) == '\0') {
            if ((uVar17 < uVar14) && (*(char *)(lVar10 + uVar20) != '\0')) {
              uVar9 = uVar20 | 1;
              if (((long)uVar9 < lVar21) && (*(char *)(lVar11 + uVar9) != '\0')) {
                if (uVar20 != 0) {
                  if (*(char *)((uVar20 - 1) + lVar11) != '\0') {
                    if (uVar12 != 0) {
                      if (*(char *)(lVar19 + uVar9) == '\0') goto LAB_0011e880;
                      goto LAB_0011e773;
                    }
                    goto LAB_0011ecec;
                  }
                  if (*(char *)(lVar10 + -1 + uVar20) == '\0') goto LAB_0011e824;
                  if (uVar12 == 0) goto LAB_0011ecec;
                  if (*(char *)(lVar19 + uVar9) == '\0') {
                    if ((lVar21 <= (long)(uVar20 + 2)) || (*(char *)(lVar19 + uVar20 + 2) == '\0'))
                    {
                      if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_0011ecec;
                      cVar2 = *(char *)((uVar20 - 2) + lVar11);
                      goto joined_r0x0011ece1;
                    }
                    if (*(char *)(lVar15 + uVar9) == '\0') {
                      if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_0011e8b3;
                      if (*(char *)(lVar11 + -2 + uVar20) == '\0') {
                        uVar8 = RemSP::Merge(*(uint *)(lVar16 + uVar20 * 4),
                                             *(uint *)(lVar16 + 8 + uVar20 * 4));
                        uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                      }
                      else {
                        if (*(char *)(lVar19 + -1 + uVar20) == '\0') goto LAB_0011ed1b;
                        uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
                        uVar13 = *(uint *)(lVar16 + 8 + uVar20 * 4);
                      }
                      uVar8 = RemSP::Merge(uVar8,uVar13);
                      *(uint *)(lVar18 + uVar20 * 4) = uVar8;
                      goto LAB_0011ecf5;
                    }
                  }
                  if (*(char *)((uVar20 - 2) + lVar11) == '\0') goto LAB_0011ebe8;
LAB_0011e8fb:
                  if (uVar20 != 0 && uVar12 != 0) {
                    if (*(char *)(lVar19 + -1 + uVar20) != '\0') {
LAB_0011eaaf:
                      if (uVar12 != 0) {
                        if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_0011ea1b;
                        goto LAB_0011e96e;
                      }
                      goto LAB_0011eafa;
                    }
LAB_0011e91f:
                    if (*(char *)(lVar19 + -2 + uVar20) != '\0') {
                      if (*(char *)(lVar7 + uVar20) != '\0') goto LAB_0011eaaf;
                      goto LAB_0011eafa;
                    }
                  }
LAB_0011eba4:
                  uVar8 = *(uint *)(lVar16 + uVar20 * 4);
                  uVar13 = *(uint *)(lVar18 + (uVar20 - 2) * 4);
LAB_0011ebb0:
                  uVar8 = RemSP::Merge(uVar8,uVar13);
                  *(uint *)(lVar18 + uVar20 * 4) = uVar8;
                  goto LAB_0011ecf5;
                }
                uVar9 = 1;
LAB_0011e824:
                if (((uVar12 != 0) && ((long)uVar9 < lVar21)) && (*(char *)(lVar19 + uVar9) != '\0')
                   ) goto LAB_0011e9db;
                if ((uVar12 == 0) || (lVar21 <= (long)(uVar20 + 2))) {
                  if (uVar12 == 0) goto LAB_0011ea4e;
                }
                else if (*(char *)(lVar19 + uVar20 + 2) != '\0') {
                  if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_0011eb60;
                  goto LAB_0011e9b0;
                }
                if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_0011e9db;
              }
              else if ((uVar20 != 0) &&
                      ((*(char *)((uVar20 - 1) + lVar10) != '\0' ||
                       (*(char *)(lVar11 + -1 + uVar20) != '\0')))) goto LAB_0011ecec;
LAB_0011ea4e:
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar8 = RemSP::length_ + 1;
              *(uint *)(lVar18 + uVar20 * 4) = RemSP::length_;
              RemSP::length_ = uVar8;
            }
            else {
              uVar9 = uVar20 | 1;
              if ((long)uVar9 < lVar21) {
                if (*(char *)(lVar11 + uVar9) != '\0') goto LAB_0011e824;
                if ((uVar17 < uVar14) && (*(char *)(lVar10 + uVar9) != '\0')) goto LAB_0011ea4e;
              }
              *(undefined4 *)(lVar18 + uVar20 * 4) = 0;
            }
          }
          else {
            if (uVar20 == 0) {
LAB_0011e940:
              uVar9 = uVar20 | 1;
              if ((uVar12 == 0) || ((lVar21 <= (long)uVar9 || (*(char *)(lVar19 + uVar9) == '\0'))))
              {
                if (((long)uVar9 < lVar21) &&
                   (((*(char *)(lVar11 + uVar9) != '\0' && (uVar12 != 0)) &&
                    ((long)(uVar20 + 2) < lVar21)))) {
                  if (*(char *)(lVar19 + uVar20 + 2) != '\0') {
                    if (*(char *)(lVar19 + uVar20) == '\0') {
                      if ((uVar20 == 0) || (*(char *)(lVar19 + -1 + uVar20) == '\0')) {
LAB_0011eb60:
                        uVar8 = *(uint *)(lVar16 + 8 + uVar20 * 4);
                        goto LAB_0011ecf1;
                      }
                      if (*(char *)(lVar15 + uVar9) == '\0') goto LAB_0011eb56;
                      goto LAB_0011e96e;
                    }
LAB_0011e9b0:
                    if ((lVar21 <= (long)uVar9) || (*(char *)(lVar15 + uVar9) == '\0')) {
                      uVar8 = *(uint *)(lVar16 + uVar20 * 4);
                      goto LAB_0011e9c4;
                    }
                    goto LAB_0011e9db;
                  }
                }
                else if (uVar12 == 0) goto LAB_0011ea4e;
                if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_0011e9db;
                if ((uVar12 == 0 || uVar20 == 0) || (*(char *)(lVar19 + -1 + uVar20) == '\0'))
                goto LAB_0011ea4e;
              }
              else {
                if (((*(char *)(lVar19 + uVar20) != '\0') || (uVar20 == 0)) ||
                   (*(char *)(lVar19 + -1 + uVar20) == '\0')) {
LAB_0011e9db:
                  uVar8 = *(uint *)(lVar16 + uVar20 * 4);
                  goto LAB_0011ecf1;
                }
LAB_0011e96e:
                if (*(char *)(lVar15 + uVar20) == '\0') {
LAB_0011eafa:
                  uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
                  goto LAB_0011eaff;
                }
              }
LAB_0011ea1b:
              uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
            }
            else {
              if (*(char *)(lVar11 + -1 + uVar20) == '\0') {
                if ((uVar14 <= uVar17) || (*(char *)(lVar10 + -1 + uVar20) == '\0'))
                goto LAB_0011e940;
                uVar9 = uVar20 | 1;
                if (((uVar12 != 0) && ((long)uVar9 < lVar21)) && (*(char *)(lVar19 + uVar9) != '\0')
                   ) {
                  if (*(char *)((uVar20 - 2) + lVar11) != '\0') goto LAB_0011e8fb;
                  if ((*(char *)(lVar19 + uVar20) != '\0') ||
                     (*(char *)(lVar19 + -1 + uVar20) == '\0')) goto LAB_0011ebe8;
LAB_0011ec25:
                  if ((uVar12 == 0) || (*(char *)(lVar15 + uVar20) == '\0')) {
                    uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
                    uVar13 = *(uint *)(lVar16 + uVar20 * 4);
LAB_0011ed8b:
                    uVar8 = RemSP::Merge(uVar8,uVar13);
                    uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  }
                  else {
                    uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
LAB_0011ecbb:
                    uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  }
                  goto LAB_0011ebb0;
                }
                if ((lVar21 <= (long)uVar9) ||
                   ((((*(char *)(lVar11 + uVar9) == '\0' || (uVar12 == 0)) ||
                     (lVar21 <= (long)(uVar20 + 2))) || (*(char *)(lVar19 + uVar20 + 2) == '\0'))))
                {
                  if (uVar12 == 0) goto LAB_0011ecec;
                  if (*(char *)(lVar19 + -1 + uVar20) == '\0') {
                    if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_0011ecec;
                    if (*(char *)((uVar20 - 2) + lVar11) == '\0') goto LAB_0011ebe8;
                    goto LAB_0011eb7e;
                  }
                  uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
                  if (*(char *)(lVar11 + -2 + uVar20) == '\0') goto LAB_0011ebec;
LAB_0011eb9b:
                  *(uint *)(lVar18 + uVar20 * 4) = uVar8;
                  goto LAB_0011ecf5;
                }
                if (*(char *)(lVar11 + -2 + uVar20) == '\0') {
                  if (*(char *)(lVar19 + uVar20) != '\0') {
                    uVar8 = *(uint *)(lVar16 + uVar20 * 4);
                    if (*(char *)(lVar15 + uVar9) == '\0') {
                      uVar13 = *(uint *)(lVar16 + 8 + uVar20 * 4);
                      goto LAB_0011ed8b;
                    }
                    goto LAB_0011ecbb;
                  }
                  if (*(char *)(lVar19 + -1 + uVar20) == '\0') goto LAB_0011e8b3;
                  if (*(char *)(lVar15 + uVar9) != '\0') goto LAB_0011ec25;
                  uVar8 = RemSP::Merge(*(uint *)(lVar16 + -8 + uVar20 * 4),
                                       *(uint *)(lVar16 + 8 + uVar20 * 4));
                  uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  goto LAB_0011ebf1;
                }
                if (*(char *)(lVar19 + -1 + uVar20) == '\0') {
                  if (*(char *)(lVar15 + uVar9) != '\0') goto LAB_0011e91f;
                  if (*(char *)(lVar19 + uVar20) != '\0') {
LAB_0011ed1b:
                    lVar1 = uVar20 - 2;
                    if ((uVar20 == 0 || uVar12 == 0) || (*(char *)(lVar19 + lVar1) == '\0')) {
                      uVar8 = RemSP::Merge(*(uint *)(lVar16 + uVar20 * 4),
                                           *(uint *)(lVar16 + 8 + uVar20 * 4));
                      uVar13 = *(uint *)(lVar18 + lVar1 * 4);
                      goto LAB_0011ebf1;
                    }
                    if (*(char *)(lVar7 + uVar20) == '\0') {
                      uVar8 = RemSP::Merge(*(uint *)(lVar16 + uVar20 * 4),
                                           *(uint *)(lVar16 + 8 + uVar20 * 4));
                      uVar13 = *(uint *)(lVar18 + lVar1 * 4);
                    }
                    else {
                      uVar8 = *(uint *)(lVar16 + lVar1 * 4);
                      uVar13 = *(uint *)(lVar16 + 8 + uVar20 * 4);
                    }
                    goto LAB_0011ebb0;
                  }
LAB_0011e8b3:
                  uVar8 = *(uint *)(lVar16 + 8 + uVar20 * 4);
                  goto LAB_0011ebec;
                }
                if (*(char *)(lVar15 + uVar9) != '\0') goto LAB_0011eaaf;
LAB_0011eb56:
                uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
LAB_0011e9c4:
                uVar13 = *(uint *)(lVar16 + 8 + uVar20 * 4);
              }
              else {
                uVar9 = uVar20 | 1;
                if (((uVar12 == 0) || (lVar21 <= (long)uVar9)) ||
                   (*(char *)(lVar19 + uVar9) == '\0')) {
                  if (((long)uVar9 < lVar21) && (*(char *)(lVar11 + uVar9) != '\0')) {
LAB_0011e880:
                    if ((uVar12 != 0) &&
                       (((long)(uVar20 + 2) < lVar21 && (*(char *)(lVar19 + uVar20 + 2) != '\0'))))
                    {
                      if (*(char *)(lVar15 + 1 + uVar20) == '\0') goto LAB_0011e8b3;
                      goto LAB_0011e773;
                    }
                  }
LAB_0011ecec:
                  uVar8 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  goto LAB_0011ecf1;
                }
LAB_0011e773:
                if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_0011e9db;
                cVar2 = *(char *)(lVar15 + uVar20);
joined_r0x0011ece1:
                if (cVar2 == '\0') {
LAB_0011ebe8:
                  uVar8 = *(uint *)(lVar16 + uVar20 * 4);
LAB_0011ebec:
                  uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  goto LAB_0011ebf1;
                }
                if (uVar20 == 0 || uVar12 == 0) goto LAB_0011eba4;
                if (*(char *)(lVar19 + -1 + uVar20) != '\0') goto LAB_0011ea1b;
LAB_0011eb7e:
                if (*(char *)(lVar19 + -2 + uVar20) == '\0') goto LAB_0011eba4;
                uVar8 = *(uint *)(lVar16 + -8 + uVar20 * 4);
                if (*(char *)(lVar7 + uVar20) != '\0') goto LAB_0011eb9b;
LAB_0011eaff:
                uVar13 = *(uint *)(lVar16 + uVar20 * 4);
              }
LAB_0011ebf1:
              uVar8 = RemSP::Merge(uVar8,uVar13);
            }
LAB_0011ecf1:
            *(uint *)(lVar18 + uVar20 * 4) = uVar8;
          }
LAB_0011ecf5:
          uVar20 = uVar20 + 2;
        } while ((long)uVar20 < lVar21);
      }
      uVar12 = uVar12 + 2;
    } while ((int)uVar12 < iVar3);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }